

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

int writeTime(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  long lVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  curl_off_t us;
  long local_28;
  
  local_28 = 0;
  if ((wovar->ci != CURLINFO_NONE) &&
     (iVar2 = curl_easy_getinfo(per->curl,wovar->ci,&local_28,
                                CONCAT44(in_register_0000000c,per_result)), iVar2 == 0)) {
    lVar1 = local_28 / 1000000;
    local_28 = local_28 % 1000000;
    if (use_json) {
      curl_mfprintf(stream,"\"%s\":",wovar->name);
    }
    curl_mfprintf(stream,"%lu.%06lu",lVar1,local_28);
    return 1;
  }
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
  return 1;
}

Assistant:

static int writeTime(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  curl_off_t us = 0;

  (void)per;
  (void)per_result;
  DEBUGASSERT(wovar->writefunc == writeTime);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &us))
      valid = true;
  }
  else {
    DEBUGASSERT(0);
  }

  if(valid) {
    curl_off_t secs = us / 1000000;
    us %= 1000000;

    if(use_json)
      fprintf(stream, "\"%s\":", wovar->name);

    fprintf(stream, "%" CURL_FORMAT_CURL_OFF_TU
            ".%06" CURL_FORMAT_CURL_OFF_TU, secs, us);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}